

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceStringsWrapper.cpp
# Opt level: O2

bool __thiscall ResourceStringsWrapper::wrap(ResourceStringsWrapper *this)

{
  Executable *v_exe;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  offset_t dataAddr;
  WORD *v_sizePtr;
  ulong uVar3;
  WORD *v_ptr;
  ResString *this_00;
  ulong dataSize;
  ResString *local_38;
  
  (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
    super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  this->parsedSize = 0;
  iVar1 = (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar2 = (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
              super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xd])(this);
    dataAddr = ResourceContentWrapper::getContentRaw(&this->super_ResourceContentWrapper);
    uVar3 = this->parsedSize;
    while (uVar3 < CONCAT44(extraout_var_00,iVar2)) {
      v_sizePtr = (WORD *)ResourceContentWrapper::getContentAt
                                    (&this->super_ResourceContentWrapper,dataAddr,RAW,2);
      if (v_sizePtr == (WORD *)0x0) {
        puts("Cannot fetch the string size!");
        break;
      }
      uVar3 = this->parsedSize + 2;
      this->parsedSize = uVar3;
      dataAddr = dataAddr + 2;
      if (*v_sizePtr != 0) {
        dataSize = (ulong)((uint)*v_sizePtr * 2);
        v_ptr = (WORD *)ResourceContentWrapper::getContentAt
                                  (&this->super_ResourceContentWrapper,dataAddr,RAW,dataSize);
        if (v_ptr == (WORD *)0x0) break;
        v_exe = (((this->super_ResourceContentWrapper).myLeaf)->super_ExeNodeWrapper).
                super_ExeElementWrapper.m_Exe;
        this_00 = (ResString *)operator_new(0x50);
        ResString::ResString(this_00,v_ptr,v_sizePtr,dataAddr,v_exe);
        local_38 = this_00;
        std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                  ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                   &(this->super_ResourceContentWrapper).super_ExeNodeWrapper.entries,
                   (ExeNodeWrapper **)&local_38);
        uVar3 = this->parsedSize + dataSize;
        this->parsedSize = uVar3;
        dataAddr = dataAddr + dataSize;
      }
    }
  }
  return CONCAT44(extraout_var,iVar1) != 0;
}

Assistant:

bool ResourceStringsWrapper::wrap()
{
    clear();
    this->parsedSize = 0;

    BYTE *c = static_cast<BYTE*>(this->getPtr());
    if (!c) {
        return false;
    }
    size_t maxSize = this->getSize();
    //printf("maxSize = %x\n", maxSize);
    offset_t startRaw = getContentRaw();
    offset_t cRaw = startRaw;

    while (parsedSize < maxSize) {

        WORD* stringSize = (WORD*) this->getContentAt(cRaw, Executable::RAW, sizeof(WORD));
        if (stringSize == NULL){
            printf("Cannot fetch the string size!\n");
            break;
        }
        this->parsedSize += sizeof(WORD);
        cRaw += sizeof(WORD);

        size_t wStrSize = (*stringSize);
        if (wStrSize == 0) {
            continue;
        }
        bufsize_t totalStrSize = wStrSize * sizeof(WORD);

        WORD* uStringPtr = (WORD*) this->getContentAt(cRaw, Executable::RAW, totalStrSize);
        if (uStringPtr == NULL) break;

        Executable *exe = this->myLeaf->getExe();
        ResString *rStr = new ResString(uStringPtr, stringSize, cRaw, exe);
        this->entries.push_back(rStr);

        this->parsedSize += totalStrSize;
        cRaw += totalStrSize;
    }
    return true;
}